

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDGrammar.hpp
# Opt level: O1

XMLSize_t __thiscall
xercesc_4_0::DTDGrammar::getElemId
          (DTDGrammar *this,uint param_1,XMLCh *param_2,XMLCh *qName,uint param_4)

{
  NameIdPool<xercesc_4_0::DTDElementDecl> *pNVar1;
  bool bVar2;
  ulong uVar3;
  DTDElementDecl *pDVar4;
  XMLSize_t XVar5;
  XMLCh *pXVar6;
  XMLCh XVar7;
  RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *pRVar8;
  
  pNVar1 = this->fElemDeclPool;
  if (pNVar1->fIdCounter != 0) {
    if ((qName == (XMLCh *)0x0) || (uVar3 = (ulong)(ushort)*qName, uVar3 == 0)) {
      uVar3 = 0;
    }
    else {
      XVar7 = qName[1];
      if (XVar7 != L'\0') {
        pXVar6 = qName + 2;
        do {
          uVar3 = (ulong)(ushort)XVar7 + (uVar3 >> 0x18) + uVar3 * 0x26;
          XVar7 = *pXVar6;
          pXVar6 = pXVar6 + 1;
        } while (XVar7 != L'\0');
      }
      uVar3 = uVar3 % (pNVar1->fBucketList).fHashModulus;
    }
    pRVar8 = (pNVar1->fBucketList).fBucketList[uVar3];
    if (pRVar8 != (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0) {
      do {
        bVar2 = StringHasher::equals
                          ((StringHasher *)&(pNVar1->fBucketList).field_0x30,qName,pRVar8->fKey);
        if (bVar2) goto LAB_003089e3;
        pRVar8 = pRVar8->fNext;
      } while (pRVar8 != (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0);
    }
    pRVar8 = (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0;
LAB_003089e3:
    if (pRVar8 != (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0) {
      pDVar4 = pRVar8->fData;
      goto LAB_003089ef;
    }
  }
  pDVar4 = (DTDElementDecl *)0x0;
LAB_003089ef:
  if (pDVar4 == (DTDElementDecl *)0x0) {
    XVar5 = 0xfffffffe;
  }
  else {
    XVar5 = (pDVar4->super_XMLElementDecl).fId;
  }
  return XVar5;
}

Assistant:

inline XMLSize_t DTDGrammar::getElemId (const   unsigned int
                                              , const XMLCh* const
                                              , const XMLCh* const    qName
                                              , unsigned int) const
{
    //
    //  In this case, we don't return zero to mean 'not found', so we have to
    //  map it to the official not found value if we don't find it.
    //
    const DTDElementDecl* decl = fElemDeclPool->getByKey(qName);
    if (!decl)
        return XMLElementDecl::fgInvalidElemId;
    return decl->getId();
}